

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

action Search::single_prediction_LDF
                 (search_private *priv,example *ecs,size_t ec_cnt,int policy,float *a_cost,
                 action override_action)

{
  wclass *pwVar1;
  wclass *pwVar2;
  size_t sVar3;
  bool bVar4;
  example *target;
  v_array<Search::action_cache> *pvVar5;
  action_cache *paVar6;
  ulong uVar7;
  unsigned_long *in_RDX;
  unsigned_long *in_RSI;
  search_private *in_RDI;
  float *in_R8;
  action in_R9D;
  action_cache *ac;
  size_t i;
  uint64_t old_offset;
  multi_ex tmp;
  polylabel old_label;
  action a;
  v_array<Search::action_cache> *this_cache;
  size_t start_K;
  action best_action;
  float best_prediction;
  wclass wc;
  bool need_partial_predictions;
  action_cache *in_stack_fffffffffffffec8;
  v_array<Search::action_cache> *in_stack_fffffffffffffed0;
  v_array<Search::action_cache> *this;
  example *in_stack_fffffffffffffed8;
  example *in_stack_fffffffffffffee8;
  example *in_stack_fffffffffffffef0;
  bool local_102;
  bool local_101;
  v_array<Search::action_cache> *local_f8;
  action_cache local_ec;
  unsigned_long *local_d0;
  unsigned_long local_c8;
  undefined1 local_c0 [124];
  float local_44;
  undefined8 local_40;
  float *local_38;
  bool local_2d;
  action local_2c;
  float *local_28;
  unsigned_long *local_18;
  unsigned_long *local_10;
  search_private *local_8;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar4 = need_memo_foreach_action(in_RDI);
  local_101 = true;
  if ((!bVar4) &&
     ((local_8->metaoverride == (BaseTask *)0x0 ||
      (local_101 = true,
      local_8->metaoverride->_foreach_action ==
      (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)))) {
    local_101 = local_2c != 0xffffffff;
  }
  local_2d = local_101;
  (*(code *)COST_SENSITIVE::cs_label)(&local_8->ldf_test_label);
  local_40._0_4_ = 0.0;
  local_40._4_4_ = 1;
  local_38 = (float *)0x0;
  v_array<COST_SENSITIVE::wclass>::push_back
            ((v_array<COST_SENSITIVE::wclass> *)in_stack_fffffffffffffed0,
             (wclass *)in_stack_fffffffffffffec8);
  local_44 = 0.0;
  local_c0._120_4_ = 0;
  local_102 = false;
  if ((local_8->is_ldf & 1U) != 0) {
    local_102 = COST_SENSITIVE::ec_is_example_header(in_stack_fffffffffffffee8);
  }
  local_c0._112_8_ = SEXT48((int)(uint)(local_102 != false));
  local_c0._104_8_ = (example *)0x0;
  if ((local_2d & 1U) != 0) {
    in_stack_fffffffffffffef0 = (example *)operator_new(0x20);
    memset(in_stack_fffffffffffffef0,0,0x20);
    local_c0._104_8_ = in_stack_fffffffffffffef0;
    v_init<Search::action_cache>();
    ((_Vector_impl_data *)&(((example_predict *)local_c0._104_8_)->indices)._begin)->_M_start =
         (pointer)local_c0._72_8_;
    (((example_predict *)local_c0._104_8_)->indices)._end = (uchar *)local_c0._80_8_;
    (((example_predict *)local_c0._104_8_)->indices).end_array = (uchar *)local_c0._88_8_;
    (((example_predict *)local_c0._104_8_)->indices).erase_count = local_c0._96_8_;
  }
  for (local_c0._68_4_ = (undefined4)local_c0._112_8_;
      (unsigned_long *)(ulong)(uint)local_c0._68_4_ < local_18;
      local_c0._68_4_ = local_c0._68_4_ + 1) {
    if ((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_c0._112_8_ !=
        (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      LabelDict::add_example_namespaces_from_example
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    }
    uVar7 = (ulong)(uint)local_c0._68_4_;
    local_c0._56_8_ = local_10[uVar7 * 0xd1a + 0xd09];
    local_c0._24_8_ = local_10[uVar7 * 0xd1a + 0xd05];
    local_c0._32_8_ = (local_10 + uVar7 * 0xd1a + 0xd05)[1];
    local_c0._40_8_ = local_10[uVar7 * 0xd1a + 0xd07];
    local_c0._48_8_ = (local_10 + uVar7 * 0xd1a + 0xd07)[1];
    pwVar1 = (local_8->ldf_test_label).costs._begin;
    pwVar2 = (local_8->ldf_test_label).costs._end;
    sVar3 = (local_8->ldf_test_label).costs.erase_count;
    local_10[(ulong)(uint)local_c0._68_4_ * 0xd1a + 0xd07] =
         (unsigned_long)(local_8->ldf_test_label).costs.end_array;
    (local_10 + (ulong)(uint)local_c0._68_4_ * 0xd1a + 0xd07)[1] = sVar3;
    local_10[(ulong)(uint)local_c0._68_4_ * 0xd1a + 0xd05] = (unsigned_long)pwVar1;
    (local_10 + (ulong)(uint)local_c0._68_4_ * 0xd1a + 0xd05)[1] = (unsigned_long)pwVar2;
    in_stack_fffffffffffffee8 = (example *)local_c0;
    std::vector<example_*,_std::allocator<example_*>_>::vector
              ((vector<example_*,_std::allocator<example_*>_> *)0x39e711);
    local_c8 = local_10[(ulong)(uint)local_c0._68_4_ * 0xd1a + 0xd04];
    local_10[(ulong)(uint)local_c0._68_4_ * 0xd1a + 0xd04] = local_8->offset;
    local_d0 = local_10 + (ulong)(uint)local_c0._68_4_ * 0xd1a;
    std::vector<example_*,_std::allocator<example_*>_>::push_back
              ((vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffed0,
               (value_type *)in_stack_fffffffffffffec8);
    target = (example *)
             LEARNER::as_multiline<char,char>((learner<char,_char> *)old_label.cs.costs._begin);
    LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::predict
              ((learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)target,
               (vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffed8,
               (size_t)in_stack_fffffffffffffed0);
    local_10[(ulong)(uint)local_c0._68_4_ * 0xd1a + 0xd04] = local_c8;
    if (local_2c == 0xffffffff) {
      if (((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(ulong)(uint)local_c0._68_4_ ==
           (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_c0._112_8_) ||
         (*(float *)(local_10 + (ulong)(uint)local_c0._68_4_ * 0xd1a + 0xd15) < local_44)) {
        local_44 = *(float *)(local_10 + (ulong)(uint)local_c0._68_4_ * 0xd1a + 0xd15);
        local_c0._120_4_ = local_c0._68_4_;
        *local_28 = local_44;
      }
    }
    else if (local_c0._68_4_ == local_2c) {
      *local_28 = *(float *)(local_10 + (ulong)(uint)local_c0._68_4_ * 0xd1a + 0xd15);
    }
    if ((example *)local_c0._104_8_ != (example *)0x0) {
      in_stack_fffffffffffffed8 = (example *)local_c0._104_8_;
      action_cache::action_cache
                (&local_ec,0.0,local_c0._68_4_,false,
                 *(float *)(local_10 + (ulong)(uint)local_c0._68_4_ * 0xd1a + 0xd15));
      v_array<Search::action_cache>::push_back(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    local_8->num_features =
         local_10[(ulong)(uint)local_c0._68_4_ * 0xd1a + 0xd14] + local_8->num_features;
    memcpy(local_10 + (ulong)(uint)local_c0._68_4_ * 0xd1a + 0xd05,local_c0 + 0x18,0x28);
    if ((shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_c0._112_8_ !=
        (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      LabelDict::del_example_namespaces_from_example(target,in_stack_fffffffffffffed8);
    }
    std::vector<example_*,_std::allocator<example_*>_>::~vector
              ((vector<example_*,_std::allocator<example_*>_> *)target);
  }
  if (local_2c == 0xffffffff) {
    *local_28 = local_44;
  }
  else {
    local_c0._120_4_ = local_2c;
  }
  if ((example *)local_c0._104_8_ != (example *)0x0) {
    local_f8 = (v_array<Search::action_cache> *)0x0;
    while (this = local_f8,
          pvVar5 = (v_array<Search::action_cache> *)
                   v_array<Search::action_cache>::size
                             ((v_array<Search::action_cache> *)local_c0._104_8_), this < pvVar5) {
      paVar6 = v_array<Search::action_cache>::operator[]
                         ((v_array<Search::action_cache> *)local_c0._104_8_,(size_t)local_f8);
      paVar6->min_cost = *local_28;
      paVar6->is_opt = paVar6->k == local_c0._120_4_;
      if ((local_8->metaoverride != (BaseTask *)0x0) &&
         (local_8->metaoverride->_foreach_action !=
          (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)) {
        (*local_8->metaoverride->_foreach_action)
                  (local_8->metaoverride->sch,local_8->t - 1,paVar6->min_cost,paVar6->k,
                   (bool)(paVar6->is_opt & 1),paVar6->cost);
      }
      local_f8 = (v_array<Search::action_cache> *)((long)&local_f8->_begin + 1);
    }
    bVar4 = need_memo_foreach_action(local_8);
    if ((bVar4) && (local_2c == 0xffffffff)) {
      v_array<v_array<Search::action_cache>_*>::push_back
                ((v_array<v_array<Search::action_cache>_*> *)this,
                 (v_array<Search::action_cache> **)in_stack_fffffffffffffec8);
    }
    else {
      v_array<Search::action_cache>::delete_v(this);
      if ((example *)local_c0._104_8_ != (example *)0x0) {
        operator_delete((void *)local_c0._104_8_);
      }
    }
  }
  local_8->total_predictions_made = local_8->total_predictions_made + 1;
  return local_c0._120_4_;
}

Assistant:

action single_prediction_LDF(search_private& priv, example* ecs, size_t ec_cnt, int policy, float& a_cost,
    action override_action)  // if override_action != -1, then we return it as the action and a_cost is set to the
                             // appropriate cost for that action
{
  bool need_partial_predictions = need_memo_foreach_action(priv) ||
      (priv.metaoverride && priv.metaoverride->_foreach_action) || (override_action != (action)-1);

  CS::cs_label.default_label(&priv.ldf_test_label);
  CS::wclass wc = {0., 1, 0., 0.};
  priv.ldf_test_label.costs.push_back(wc);

  // keep track of best (aka chosen) action
  float best_prediction = 0.;
  action best_action = 0;

  size_t start_K = (priv.is_ldf && COST_SENSITIVE::ec_is_example_header(ecs[0])) ? 1 : 0;

  v_array<action_cache>* this_cache = nullptr;
  if (need_partial_predictions)
  {
    this_cache = new v_array<action_cache>();
    *this_cache = v_init<action_cache>();
  }

  for (action a = (uint32_t)start_K; a < ec_cnt; a++)
  {
    cdbg << "== single_prediction_LDF a=" << a << "==" << endl;
    if (start_K > 0)
      LabelDict::add_example_namespaces_from_example(ecs[a], ecs[0]);

    polylabel old_label = ecs[a].l;
    ecs[a].l.cs = priv.ldf_test_label;

    multi_ex tmp;
    uint64_t old_offset = ecs[a].ft_offset;
    ecs[a].ft_offset = priv.offset;
    tmp.push_back(&ecs[a]);
    as_multiline(priv.base_learner)->predict(tmp, policy);

    ecs[a].ft_offset = old_offset;
    cdbg << "partial_prediction[" << a << "] = " << ecs[a].partial_prediction << endl;

    if (override_action != (action)-1)
    {
      if (a == override_action)
        a_cost = ecs[a].partial_prediction;
    }
    else if ((a == start_K) || (ecs[a].partial_prediction < best_prediction))
    {
      best_prediction = ecs[a].partial_prediction;
      best_action = a;
      a_cost = best_prediction;
    }
    if (this_cache)
      this_cache->push_back(action_cache(0., a, false, ecs[a].partial_prediction));

    priv.num_features += ecs[a].num_features;
    ecs[a].l = old_label;
    if (start_K > 0)
      LabelDict::del_example_namespaces_from_example(ecs[a], ecs[0]);
  }
  if (override_action != (action)-1)
    best_action = override_action;
  else
    a_cost = best_prediction;

  if (this_cache)
  {
    for (size_t i = 0; i < this_cache->size(); i++)
    {
      action_cache& ac = (*this_cache)[i];
      ac.min_cost = a_cost;
      ac.is_opt = (ac.k == best_action);
      if (priv.metaoverride && priv.metaoverride->_foreach_action)
        priv.metaoverride->_foreach_action(*priv.metaoverride->sch, priv.t - 1, ac.min_cost, ac.k, ac.is_opt, ac.cost);
    }
    if (need_memo_foreach_action(priv) && (override_action == (action)-1))
      priv.memo_foreach_action.push_back(this_cache);
    else
    {
      this_cache->delete_v();
      delete this_cache;
    }
  }

  // TODO: generate raw predictions if necessary

  priv.total_predictions_made++;
  return best_action;
}